

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O3

void av1_reset_entropy_context(MACROBLOCKD *xd,BLOCK_SIZE bsize,int num_planes)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  ENTROPY_CONTEXT **ppEVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = (uint)xd->is_chroma_ref * (num_planes + -1);
  if (-1 < iVar4) {
    uVar5 = (ulong)(iVar4 + 1);
    ppEVar3 = &xd->plane[0].left_entropy_context;
    do {
      BVar1 = av1_ss_size_lookup[bsize][*(int *)((long)ppEVar3 + -0x74)][*(int *)(ppEVar3 + -0xe)];
      bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
      memset(ppEVar3[-1],0,
             (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar1]);
      memset(*ppEVar3,0,(ulong)bVar2);
      ppEVar3 = ppEVar3 + 0x146;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void av1_reset_entropy_context(MACROBLOCKD *xd, BLOCK_SIZE bsize,
                               const int num_planes) {
  assert(bsize < BLOCK_SIZES_ALL);
  const int nplanes = 1 + (num_planes - 1) * xd->is_chroma_ref;
  for (int i = 0; i < nplanes; i++) {
    struct macroblockd_plane *const pd = &xd->plane[i];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const int txs_wide = mi_size_wide[plane_bsize];
    const int txs_high = mi_size_high[plane_bsize];
    memset(pd->above_entropy_context, 0, sizeof(ENTROPY_CONTEXT) * txs_wide);
    memset(pd->left_entropy_context, 0, sizeof(ENTROPY_CONTEXT) * txs_high);
  }
}